

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3ExprCodeTemp(Parse *pParse,Expr *pExpr,int *pReg)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  int target;
  
  if (pParse->nTempReg == '\0') {
    target = pParse->nMem + 1;
    pParse->nMem = target;
  }
  else {
    bVar1 = pParse->nTempReg - 1;
    pParse->nTempReg = bVar1;
    target = pParse->aTempReg[bVar1];
  }
  iVar2 = sqlite3ExprCodeTarget(pParse,pExpr,target);
  iVar3 = target;
  if ((iVar2 != target) && (iVar3 = 0, target != 0)) {
    bVar1 = pParse->nTempReg;
    if ((ulong)bVar1 < 8) {
      lVar4 = 0;
      do {
        if (*(int *)((long)&pParse->aColCache[0].iReg + lVar4) == target) {
          (&pParse->aColCache[0].tempReg)[lVar4] = '\x01';
          goto LAB_00195926;
        }
        lVar4 = lVar4 + 0x18;
      } while ((int)lVar4 != 0xf0);
      pParse->nTempReg = bVar1 + 1;
      pParse->aTempReg[bVar1] = target;
LAB_00195926:
      iVar3 = 0;
    }
  }
  *pReg = iVar3;
  return iVar2;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprCodeTemp(Parse *pParse, Expr *pExpr, int *pReg){
  int r1 = sqlite3GetTempReg(pParse);
  int r2 = sqlite3ExprCodeTarget(pParse, pExpr, r1);
  if( r2==r1 ){
    *pReg = r1;
  }else{
    sqlite3ReleaseTempReg(pParse, r1);
    *pReg = 0;
  }
  return r2;
}